

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::z_formatter<spdlog::details::scoped_padder>::format
          (z_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  scoped_padder p;
  scoped_padder local_80;
  ulong local_58 [2];
  buffer<char> local_48;
  memory_buf_t *local_28;
  
  scoped_padder::scoped_padder(&local_80,6,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = (msg->time).__d.__r;
  if (lVar1 - (this->last_update_).__d.__r < 10000000000) {
    uVar7 = this->offset_minutes_;
  }
  else {
    auVar3 = SEXT816(tm_time->tm_gmtoff) * ZEXT816(0x8888888888888889);
    uVar7 = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
    this->offset_minutes_ = uVar7;
    (this->last_update_).__d.__r = lVar1;
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar2 = (dest->super_buffer<char>).capacity_;
  uVar6 = sVar5 + 1;
  if ((int)uVar7 < 0) {
    if (uVar2 < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = '-';
    uVar7 = -uVar7;
  }
  else {
    if (uVar2 < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = '+';
  }
  if (uVar7 < 6000) {
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    bVar4 = (byte)((uVar7 / 0x3c & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar4 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)((ulong)uVar7 / 0x3c) + bVar4 * -10 | 0x30;
  }
  else {
    local_48.size_ = (dest->super_buffer<char>).size_;
    local_48._vptr_buffer = (_func_int **)&PTR_grow_002059b0;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args.desc_ = 1;
    local_58[0] = (ulong)uVar7 / 0x3c;
    local_48.capacity_ = local_48.size_;
    local_28 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_48,fmt,args,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = ':';
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  bVar4 = (byte)((uVar7 % 0x3c) / 10);
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = bVar4 | 0x30;
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = (char)(uVar7 % 0x3c) + bVar4 * -10 | 0x30;
  scoped_padder::~scoped_padder(&local_80);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }